

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

Element __thiscall ftxui::window(ftxui *this,Element *title,Element *content)

{
  ftxui *args_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  shared_ptr<ftxui::Node> local_68;
  shared_ptr<ftxui::Node> local_58;
  Elements local_48;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_30;
  Element *content_local;
  Element *title_local;
  
  args_1 = this;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = content;
  content_local = title;
  title_local = (Element *)this;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_58,content);
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_68,title);
  unpack<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            (&local_48,(ftxui *)&local_58,&local_68,(shared_ptr<ftxui::Node> *)args_1);
  std::
  make_shared<ftxui::Border,std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>>
            (&local_30);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::Border,void>
            ((shared_ptr<ftxui::Node> *)this,(shared_ptr<ftxui::Border> *)&local_30);
  std::shared_ptr<ftxui::Border>::~shared_ptr((shared_ptr<ftxui::Border> *)&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_48);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_68);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_58);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element window(Element title, Element content) {
  return std::make_shared<Border>(unpack(std::move(content), std::move(title)));
}